

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O3

Position __thiscall AI::turn(AI *this,Position *other)

{
  Position PVar1;
  int iVar2;
  ulong uVar3;
  Position PVar4;
  ulong uVar5;
  long lVar6;
  long lVar7;
  vector<Position,_std::allocator<Position>_> available;
  Position local_50;
  vector<Position,_std::allocator<Position>_> local_48;
  
  local_48.super__Vector_base<Position,_std::allocator<Position>_>._M_impl.super__Vector_impl_data.
  _M_start = (Position *)0x0;
  local_48.super__Vector_base<Position,_std::allocator<Position>_>._M_impl.super__Vector_impl_data.
  _M_finish = (Position *)0x0;
  local_48.super__Vector_base<Position,_std::allocator<Position>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (Position *)0x0;
  lVar7 = 0;
  do {
    lVar6 = 0;
    do {
      if (*(int *)(*(long *)&(this->board->
                             super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                             )._M_impl.super__Vector_impl_data._M_start[lVar7].
                             super__Vector_base<int,_std::allocator<int>_>._M_impl.
                             super__Vector_impl_data + lVar6 * 4) == 0) {
        local_50.x = (int)lVar7;
        local_50.y = (int)lVar6;
        if (local_48.super__Vector_base<Position,_std::allocator<Position>_>._M_impl.
            super__Vector_impl_data._M_finish ==
            local_48.super__Vector_base<Position,_std::allocator<Position>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<Position,_std::allocator<Position>_>::_M_realloc_insert<Position>
                    (&local_48,
                     (iterator)
                     local_48.super__Vector_base<Position,_std::allocator<Position>_>._M_impl.
                     super__Vector_impl_data._M_finish,&local_50);
        }
        else {
          PVar1.y = local_50.y;
          PVar1.x = local_50.x;
          *local_48.super__Vector_base<Position,_std::allocator<Position>_>._M_impl.
           super__Vector_impl_data._M_finish = PVar1;
          local_48.super__Vector_base<Position,_std::allocator<Position>_>._M_impl.
          super__Vector_impl_data._M_finish =
               local_48.super__Vector_base<Position,_std::allocator<Position>_>._M_impl.
               super__Vector_impl_data._M_finish + 1;
        }
      }
      lVar6 = lVar6 + 1;
    } while (lVar6 != 0xf);
    lVar7 = lVar7 + 1;
  } while (lVar7 != 0xf);
  if (local_48.super__Vector_base<Position,_std::allocator<Position>_>._M_impl.
      super__Vector_impl_data._M_start ==
      local_48.super__Vector_base<Position,_std::allocator<Position>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    uVar5 = 0;
    uVar3 = 0;
    if (local_48.super__Vector_base<Position,_std::allocator<Position>_>._M_impl.
        super__Vector_impl_data._M_start == (Position *)0x0) {
      PVar4.x = 0;
      PVar4.y = 0;
      return PVar4;
    }
  }
  else {
    iVar2 = rand();
    uVar5 = (ulong)(long)iVar2 %
            (ulong)((long)local_48.super__Vector_base<Position,_std::allocator<Position>_>._M_impl.
                          super__Vector_impl_data._M_finish -
                    (long)local_48.super__Vector_base<Position,_std::allocator<Position>_>._M_impl.
                          super__Vector_impl_data._M_start >> 3);
    uVar3 = (ulong)(uint)local_48.super__Vector_base<Position,_std::allocator<Position>_>._M_impl.
                         super__Vector_impl_data._M_start[uVar5].x;
    uVar5 = (ulong)(uint)local_48.super__Vector_base<Position,_std::allocator<Position>_>._M_impl.
                         super__Vector_impl_data._M_start[uVar5].y << 0x20;
  }
  operator_delete(local_48.super__Vector_base<Position,_std::allocator<Position>_>._M_impl.
                  super__Vector_impl_data._M_start);
  return (Position)(uVar5 | uVar3);
}

Assistant:

Position AI::turn(const Position &other) {
    /*
     * TODO: Write your own ai here!
     * Here is a simple AI which just put chess at empty position!
     * 代做：在这里写下你的AI。
     * 这里有一个示例AI，它只会寻找第一个可下的位置进行落子。
     */
    int i, j;
    vector<Position> available;

    for (i = 0; i < BOARD_SIZE; i++) {
        for (j = 0; j < BOARD_SIZE; j++) {
            if (EMPTY == board[i][j]) {
                available.push_back(Position{i, j});
            }
        }
    }

    if (!available.empty()) {
        return available[rand() % available.size()];
    }

    return {0, 0};
}